

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

char * __thiscall
FailableMemoryAllocator::alloc_memory
          (FailableMemoryAllocator *this,size_t size,char *file,size_t line)

{
  bool bVar1;
  char *pcVar2;
  LocationToFailAllocNode *local_40;
  LocationToFailAllocNode *previous;
  LocationToFailAllocNode *current;
  size_t line_local;
  char *file_local;
  size_t size_local;
  FailableMemoryAllocator *this_local;
  
  this->currentAllocNumber_ = this->currentAllocNumber_ + 1;
  previous = this->head_;
  local_40 = (LocationToFailAllocNode *)0x0;
  while( true ) {
    if (previous == (LocationToFailAllocNode *)0x0) {
      pcVar2 = TestMemoryAllocator::alloc_memory(&this->super_TestMemoryAllocator,size,file,line);
      return pcVar2;
    }
    bVar1 = LocationToFailAllocNode::shouldFail(previous,this->currentAllocNumber_,file,line);
    if (bVar1) break;
    local_40 = previous;
    previous = previous->next_;
  }
  if (local_40 == (LocationToFailAllocNode *)0x0) {
    this->head_ = previous->next_;
  }
  else {
    local_40->next_ = previous->next_;
  }
  (*(this->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (this,previous,size,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
             ,0x166);
  return (char *)0x0;
}

Assistant:

char* FailableMemoryAllocator::alloc_memory(size_t size, const char* file, size_t line)
{
    currentAllocNumber_++;
    LocationToFailAllocNode* current = head_;
    LocationToFailAllocNode* previous = NULLPTR;

    while (current) {
      if (current->shouldFail(currentAllocNumber_, file, line)) {
        if (previous) previous->next_ = current->next_;
        else head_ = current->next_;

        free_memory((char*) current, size, __FILE__, __LINE__);
        return NULLPTR;
      }
      previous = current;
      current = current->next_;
    }
    return TestMemoryAllocator::alloc_memory(size, file, line);
}